

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int64_t mp_decode_int(char **data)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint8_t c;
  char **data_local;
  
  bVar1 = mp_load_u8(data);
  switch(bVar1) {
  case 0xd0:
    uVar2 = mp_load_u8(data);
    data_local = (char **)(long)(char)uVar2;
    break;
  case 0xd1:
    uVar3 = mp_load_u16(data);
    data_local = (char **)(long)(short)uVar3;
    break;
  case 0xd2:
    uVar4 = mp_load_u32(data);
    data_local = (char **)(long)(int)uVar4;
    break;
  case 0xd3:
    data_local = (char **)mp_load_u64(data);
    break;
  default:
    if (bVar1 < 0xe0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0x758,"int64_t mp_decode_int(const char **)");
    }
    data_local = (char **)(long)(char)bVar1;
  }
  return (int64_t)data_local;
}

Assistant:

MP_IMPL int64_t
mp_decode_int(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xd0:
		return (int8_t) mp_load_u8(data);
	case 0xd1:
		return (int16_t) mp_load_u16(data);
	case 0xd2:
		return (int32_t) mp_load_u32(data);
	case 0xd3:
		return (int64_t) mp_load_u64(data);
	default:
		if (mp_unlikely(c < 0xe0))
			mp_unreachable();
		return (int8_t) (c);
	}
}